

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O3

LispPTR makefreearrayblock(LispPTR block,DLword length)

{
  DLword *pDVar1;
  uint uVar2;
  
  if ((block & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)block);
  }
  pDVar1 = Lisp_world + block;
  *(undefined2 *)((ulong)pDVar1 ^ 2) = 0xaaa8;
  *pDVar1 = length;
  uVar2 = (block + (uint)length * 2) - 2;
  if ((block & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  pDVar1 = Lisp_world + uVar2;
  *(undefined2 *)((ulong)pDVar1 ^ 2) = 0xaaa8;
  *pDVar1 = length;
  return block;
}

Assistant:

LispPTR makefreearrayblock(LispPTR block, DLword length) {
  LispPTR trailer;
  struct arrayblock *bbase;
  struct abdum *dbase;
  bbase = (struct arrayblock *)NativeAligned4FromLAddr(block);
  dbase = (struct abdum *)WORDPTR(bbase);
  dbase->abflags = FREEARRAYFLAGWORD;
  bbase->arlen = length;
  trailer = Trailer(block, bbase);
  bbase = (struct arrayblock *)NativeAligned4FromLAddr(trailer);
  dbase = (struct abdum *)WORDPTR(bbase);
  dbase->abflags = FREEARRAYFLAGWORD;
  bbase->arlen = length;
  return (block);
}